

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledHorizontal.cpp
# Opt level: O2

bool __thiscall
Rml::DecoratorTiledHorizontal::Initialise
          (DecoratorTiledHorizontal *this,Tile *_tiles,Texture *_textures)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  TextureFileIndex *pTVar8;
  byte bVar9;
  Texture texture;
  
  bVar9 = 0;
  pTVar8 = &_textures->file_index;
  for (lVar5 = 0x30; lVar5 != 0x114; lVar5 = lVar5 + 0x4c) {
    puVar6 = (undefined4 *)((long)(&_tiles->tile_data + -3) + lVar5);
    puVar7 = (undefined4 *)
             ((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5);
    for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    }
    texture._8_8_ = *(undefined8 *)pTVar8;
    texture.render_manager = ((Texture *)(pTVar8 + -2))->render_manager;
    iVar3 = Decorator::AddTexture((Decorator *)this,texture);
    *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = iVar3;
    pTVar8 = pTVar8 + 4;
  }
  uVar1 = *(uint *)&this->field_0x30;
  uVar2 = *(uint *)&this->field_0x7c;
  if (uVar1 == 0xffffffff) {
    if (-1 < (int)uVar2) {
      puVar6 = (undefined4 *)&this->field_0x7c;
      puVar7 = (undefined4 *)&this->field_0x30;
      for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar7 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      lVar5 = 100;
      goto LAB_0027bfc8;
    }
  }
  else if (-1 < (int)uVar1 && uVar2 == 0xffffffff) {
    puVar6 = (undefined4 *)&this->field_0x30;
    puVar7 = (undefined4 *)&this->field_0x7c;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    }
    lVar5 = 0xb0;
LAB_0027bfc8:
    *(undefined4 *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = 1
    ;
    goto LAB_0027bfd8;
  }
  if ((uVar2 & uVar1) == 0xffffffff) {
    return false;
  }
LAB_0027bfd8:
  return *(int *)&this->field_0xc8 != -1;
}

Assistant:

bool DecoratorTiledHorizontal::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 3; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// If only one side of the decorator has been configured, then mirror the texture for the other side.
	if (tiles[LEFT].texture_index == -1 && tiles[RIGHT].texture_index > -1)
	{
		tiles[LEFT] = tiles[RIGHT];
		tiles[LEFT].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT].texture_index == -1 && tiles[LEFT].texture_index > -1)
	{
		tiles[RIGHT] = tiles[LEFT];
		tiles[RIGHT].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT].texture_index == -1 && tiles[RIGHT].texture_index == -1)
		return false;

	if (tiles[CENTRE].texture_index == -1)
		return false;

	return true;
}